

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O3

void __thiscall RefTable::AllocNodes(RefTable *this,SQUnsignedInteger size)

{
  RefNode *pRVar1;
  RefNode *pRVar2;
  RefNode **ppRVar3;
  long lVar4;
  RefNode **ppRVar5;
  
  ppRVar3 = (RefNode **)sq_vm_malloc(size * 0x28);
  pRVar1 = (RefNode *)(ppRVar3 + size);
  pRVar2 = pRVar1;
  ppRVar5 = ppRVar3;
  for (lVar4 = size - 1; lVar4 != 0; lVar4 = lVar4 + -1) {
    *ppRVar5 = (RefNode *)0x0;
    (pRVar2->obj).super_SQObject._type = OT_NULL;
    (pRVar2->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
    pRVar2->refs = 0;
    pRVar2->next = pRVar2 + 1;
    ppRVar5 = ppRVar5 + 1;
    pRVar2 = pRVar2 + 1;
  }
  ppRVar3[size - 1] = (RefNode *)0x0;
  (pRVar2->obj).super_SQObject._type = OT_NULL;
  (pRVar2->obj).super_SQObject._unVal.pTable = (SQTable *)0x0;
  pRVar2->refs = 0;
  pRVar2->next = (RefNode *)0x0;
  this->_freelist = pRVar1;
  this->_nodes = pRVar1;
  this->_buckets = ppRVar3;
  this->_slotused = 0;
  this->_numofslots = size;
  return;
}

Assistant:

void RefTable::AllocNodes(SQUnsignedInteger size)
{
    RefNode **bucks;
    RefNode *nodes;
    bucks = (RefNode **)SQ_MALLOC((size * sizeof(RefNode *)) + (size * sizeof(RefNode)));
    nodes = (RefNode *)&bucks[size];
    RefNode *temp = nodes;
    SQUnsignedInteger n;
    for(n = 0; n < size - 1; n++) {
        bucks[n] = NULL;
        temp->refs = 0;
        new (&temp->obj) SQObjectPtr;
        temp->next = temp+1;
        temp++;
    }
    bucks[n] = NULL;
    temp->refs = 0;
    new (&temp->obj) SQObjectPtr;
    temp->next = NULL;
    _freelist = nodes;
    _nodes = nodes;
    _buckets = bucks;
    _slotused = 0;
    _numofslots = size;
}